

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.cpp
# Opt level: O2

error_or_n<const_gsl::span<std::uint8_t>_> *
pstore::http::details::decode_payload
          (error_or_n<const_gsl::span<std::uint8_t>_> *__return_storage_ptr__,
          uint64_t expected_length,span<const_unsigned_char,__1L> *mask,
          span<unsigned_char,__1L> *payload)

{
  byte bVar1;
  long value;
  unsigned_long uVar2;
  byte *pbVar3;
  index_type ctr;
  long idx;
  error_or<std::tuple<pstore::gsl::span<unsigned_char,__1L>_>_> eStack_48;
  
  value = (payload->storage_).super_extent_type<_1L>.size_;
  if (-1 < value) {
    uVar2 = unsigned_cast<long,unsigned_long,void>(value);
    if (uVar2 == expected_length) {
      for (idx = 0; value != idx; idx = idx + 1) {
        pbVar3 = pstore::gsl::span<const_unsigned_char,_-1L>::operator[]
                           (mask,(ulong)((uint)idx & 3));
        bVar1 = *pbVar3;
        pbVar3 = pstore::gsl::span<unsigned_char,_-1L>::operator[](payload,idx);
        *pbVar3 = *pbVar3 ^ bVar1;
      }
      error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::
      error_or<pstore::gsl::span<unsigned_char,_1l>const&>
                ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>> *)&eStack_48,payload);
      error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>const>>::
      error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>,void>
                (__return_storage_ptr__,&eStack_48);
      goto LAB_0016492a;
    }
  }
  error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::error_or<pstore::http::ws_error,void>
            ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>> *)&eStack_48,
             insufficient_data);
  error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>const>>::
  error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>,void>(__return_storage_ptr__,&eStack_48)
  ;
LAB_0016492a:
  error_or<std::tuple<pstore::gsl::span<unsigned_char,_-1L>_>_>::~error_or(&eStack_48);
  return __return_storage_ptr__;
}

Assistant:

error_or_n<gsl::span<std::uint8_t> const>
        details::decode_payload (std::uint64_t const expected_length,
                                 gsl::span<std::uint8_t const> const & mask,
                                 gsl::span<std::uint8_t> const & payload) {
            using return_type = error_or_n<gsl::span<std::uint8_t>>;
            auto const size = payload.size ();
            if (size < 0 || unsigned_cast (size) != expected_length) {
                return return_type{ws_error::insufficient_data};
            }

            // "Octet i of the transformed data ("transformed-octet-i") is the XOR of octet i of
            // the original data ("original-octet-i") with octet at index i modulo 4 of the
            // masking key ("masking-key-octet-j"):
            //     j                   = i MOD 4
            //     transformed-octet-i = original-octet-i XOR masking-key-octet-j"

            for (auto ctr = gsl::span<std::uint8_t>::index_type{0}; ctr < size; ++ctr) {
                payload[ctr] ^= mask[ctr % 4];
            }
            return return_type{in_place, payload};
        }